

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O1

void __thiscall
QTextStreamPrivate::putString(QTextStreamPrivate *this,QLatin1StringView data,bool number)

{
  FieldAlignment FVar1;
  undefined7 in_register_00000009;
  char16_t *__n;
  qsizetype len;
  long lVar2;
  long lVar3;
  byte *__buf;
  long lVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QString local_70;
  QString local_58;
  char16_t local_3a;
  long local_38;
  
  __buf = (byte *)data.m_data;
  lVar4 = data.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (long)(this->params).fieldWidth;
  lVar3 = lVar2 - lVar4;
  if (lVar3 == 0 || lVar2 < lVar4) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      write(this,(int)data.m_size,__buf,CONCAT71(in_register_00000009,number));
      return;
    }
    goto LAB_00300721;
  }
  FVar1 = (this->params).fieldAlignment;
  switch(FVar1) {
  case AlignLeft:
    lVar2 = lVar3;
    goto LAB_003005a3;
  case AlignRight:
  case AlignAccountingStyle:
    lVar2 = 0;
    len = lVar3;
    break;
  case AlignCenter:
    len = lVar3 / 2;
    lVar2 = lVar3 - len;
    break;
  default:
    lVar2 = 0;
LAB_003005a3:
    len = 0;
  }
  __n = (char16_t *)CONCAT71(in_register_00000009,!number || FVar1 != AlignAccountingStyle);
  if (number && FVar1 == AlignAccountingStyle) {
    if (lVar4 < 1) {
      local_3a = L'\0';
    }
    else {
      local_3a = (char16_t)*__buf;
    }
    QLocale::negativeSign(&local_58,&this->locale);
    if (local_58.d.size == 1) {
      bVar5 = *local_58.d.ptr == local_3a;
      __n = local_58.d.ptr;
    }
    else {
      bVar5 = false;
    }
    __n = (char16_t *)CONCAT71((int7)((ulong)__n >> 8),1);
    if (!bVar5) {
      QLocale::positiveSign(&local_70,&this->locale);
      if (local_70.d.size == 1) {
        __n = (char16_t *)CONCAT71((int7)((ulong)local_70.d.ptr >> 8),*local_70.d.ptr == local_3a);
      }
      else {
        __n = (char16_t *)0x0;
      }
    }
    if ((!bVar5) && (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0)) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        __n = (char16_t *)((ulong)__n & 0xffffffff);
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        __n = (char16_t *)((ulong)__n & 0xffffffff);
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((char)__n != '\0') {
      write(this,(int)&local_3a,(void *)0x1,(size_t)__n);
      __buf = __buf + 1;
      lVar4 = lVar4 + -1;
    }
  }
  writePadding(this,len);
  write(this,(int)lVar4,__buf,(size_t)__n);
  writePadding(this,lVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00300721:
  __stack_chk_fail();
}

Assistant:

void QTextStreamPrivate::putString(QLatin1StringView data, bool number)
{
    if (Q_UNLIKELY(params.fieldWidth > data.size())) {

        // handle padding

        const PaddingResult pad = padding(data.size());

        if (params.fieldAlignment == QTextStream::AlignAccountingStyle && number) {
            const QChar sign = data.size() > 0 ? QLatin1Char(*data.data()) : QChar();
            if (sign == locale.negativeSign() || sign == locale.positiveSign()) {
                // write the sign before the padding, then skip it later
                write(&sign, 1);
                data = QLatin1StringView(data.data() + 1, data.size() - 1);
            }
        }

        writePadding(pad.left);
        write(data);
        writePadding(pad.right);
    } else {
        write(data);
    }
}